

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c_dispatch.cpp
# Opt level: O0

void __thiscall
FConsoleAlias::FConsoleAlias(FConsoleAlias *this,char *name,char *command,bool noSave)

{
  char *pcVar1;
  FString *local_48;
  FString local_40 [3];
  byte local_21;
  char *pcStack_20;
  bool noSave_local;
  char *command_local;
  char *name_local;
  FConsoleAlias *this_local;
  
  local_21 = noSave;
  pcStack_20 = command;
  command_local = name;
  name_local = (char *)this;
  FConsoleCommand::FConsoleCommand(&this->super_FConsoleCommand,name,(CCmdRun)0x0);
  (this->super_FConsoleCommand)._vptr_FConsoleCommand = (_func_int **)&PTR__FConsoleAlias_00b69340;
  local_48 = this->m_Command;
  do {
    FString::FString(local_48);
    local_48 = local_48 + 1;
  } while (local_48 != (FString *)&this->bDoSubstitution);
  this->bRunning = false;
  this->bKill = false;
  FString::operator=(this->m_Command + (local_21 & 1),pcStack_20);
  FString::FString(local_40);
  FString::operator=(this->m_Command + ((byte)~local_21 & 1),local_40);
  FString::~FString(local_40);
  pcVar1 = strchr(pcStack_20,0x25);
  this->bDoSubstitution = pcVar1 != (char *)0x0;
  return;
}

Assistant:

FConsoleAlias::FConsoleAlias (const char *name, const char *command, bool noSave)
	: FConsoleCommand (name, NULL),
	  bRunning(false), bKill(false)
{
	m_Command[noSave] = command;
	m_Command[!noSave] = FString();
	// If the command contains % characters, assume they are parameter markers
	// for substitution when the command is executed.
	bDoSubstitution = (strchr (command, '%') != NULL);
}